

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# events.c
# Opt level: O0

void key_callback(GLFWwindow *window,int key,int scancode,int action,int mods)

{
  uint uVar1;
  uint uVar2;
  void *pvVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  double dVar8;
  char *name;
  Slot *slot;
  int mods_local;
  int action_local;
  int scancode_local;
  int key_local;
  GLFWwindow *window_local;
  
  pvVar3 = glfwGetWindowUserPointer(window);
  pcVar4 = glfwGetKeyName(key,scancode);
  uVar2 = counter;
  if (pcVar4 == (char *)0x0) {
    counter = counter + 1;
    uVar1 = *(uint *)((long)pvVar3 + 8);
    dVar8 = glfwGetTime();
    pcVar4 = get_key_name(key);
    pcVar5 = get_mods_name(mods);
    pcVar6 = get_action_name(action);
    printf("%08x to %i at %0.3f: Key 0x%04x Scancode 0x%04x (%s) (with%s) was %s\n",dVar8,
           (ulong)uVar2,(ulong)uVar1,(ulong)(uint)key,(ulong)(uint)scancode,pcVar4,pcVar5,pcVar6);
  }
  else {
    counter = counter + 1;
    uVar1 = *(uint *)((long)pvVar3 + 8);
    dVar8 = glfwGetTime();
    pcVar5 = get_key_name(key);
    pcVar6 = get_mods_name(mods);
    pcVar7 = get_action_name(action);
    printf("%08x to %i at %0.3f: Key 0x%04x Scancode 0x%04x (%s) (%s) (with%s) was %s\n",dVar8,
           (ulong)uVar2,(ulong)uVar1,(ulong)(uint)key,(ulong)(uint)scancode,pcVar5,pcVar4,pcVar6,
           pcVar7);
  }
  if ((action == 1) && (key == 0x43)) {
    *(uint *)((long)pvVar3 + 0xc) = (uint)((*(int *)((long)pvVar3 + 0xc) != 0 ^ 0xffU) & 1);
    pcVar4 = "disabled";
    if (*(int *)((long)pvVar3 + 0xc) != 0) {
      pcVar4 = "enabled";
    }
    printf("(( closing %s ))\n",pcVar4);
  }
  return;
}

Assistant:

static void key_callback(GLFWwindow* window, int key, int scancode, int action, int mods)
{
    Slot* slot = glfwGetWindowUserPointer(window);
    const char* name = glfwGetKeyName(key, scancode);

    if (name)
    {
        printf("%08x to %i at %0.3f: Key 0x%04x Scancode 0x%04x (%s) (%s) (with%s) was %s\n",
               counter++, slot->number, glfwGetTime(), key, scancode,
               get_key_name(key),
               name,
               get_mods_name(mods),
               get_action_name(action));
    }
    else
    {
        printf("%08x to %i at %0.3f: Key 0x%04x Scancode 0x%04x (%s) (with%s) was %s\n",
               counter++, slot->number, glfwGetTime(), key, scancode,
               get_key_name(key),
               get_mods_name(mods),
               get_action_name(action));
    }

    if (action != GLFW_PRESS)
        return;

    switch (key)
    {
        case GLFW_KEY_C:
        {
            slot->closeable = !slot->closeable;

            printf("(( closing %s ))\n", slot->closeable ? "enabled" : "disabled");
            break;
        }
    }
}